

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void I210ToAR30Row_C(uint16_t *src_y,uint16_t *src_u,uint16_t *src_v,uint8_t *rgb_buf,
                    YuvConstants *yuvconstants,int width)

{
  uint8_t *puVar1;
  undefined4 in_register_0000008c;
  long lVar2;
  int r;
  int g;
  int b;
  int local_74;
  int local_70;
  int local_6c;
  uint8_t *local_68;
  int local_5c;
  uint16_t *local_58;
  uint16_t *local_50;
  uint16_t *local_48;
  YuvConstants *local_40;
  ulong local_38;
  
  local_38 = CONCAT44(in_register_0000008c,width);
  local_5c = width + -1;
  local_68 = rgb_buf;
  local_58 = src_y;
  local_50 = src_u;
  local_48 = src_v;
  local_40 = yuvconstants;
  for (lVar2 = 0; (int)lVar2 < local_5c; lVar2 = lVar2 + 2) {
    libyuv::YuvPixel16(src_y[lVar2],*(int16_t *)((long)src_u + lVar2),
                       *(int16_t *)((long)src_v + lVar2),&local_6c,&local_70,&local_74,yuvconstants)
    ;
    puVar1 = local_68;
    libyuv::StoreAR30(local_68,local_6c,local_70,local_74);
    libyuv::YuvPixel16(src_y[lVar2 + 1],*(int16_t *)((long)src_u + lVar2),
                       *(int16_t *)((long)src_v + lVar2),&local_6c,&local_70,&local_74,yuvconstants)
    ;
    libyuv::StoreAR30(puVar1 + 4,local_6c,local_70,local_74);
    local_68 = puVar1 + 8;
  }
  if ((local_38 & 1) == 0) {
    return;
  }
  libyuv::YuvPixel16(local_58[lVar2],*(int16_t *)((long)local_50 + lVar2),
                     *(int16_t *)((long)local_48 + lVar2),&local_6c,&local_70,&local_74,local_40);
  libyuv::StoreAR30(local_68,local_6c,local_70,local_74);
  return;
}

Assistant:

void I210ToAR30Row_C(const uint16_t* src_y,
                     const uint16_t* src_u,
                     const uint16_t* src_v,
                     uint8_t* rgb_buf,
                     const struct YuvConstants* yuvconstants,
                     int width) {
  int x;
  int b;
  int g;
  int r;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel16(src_y[0], src_u[0], src_v[0], &b, &g, &r, yuvconstants);
    StoreAR30(rgb_buf, b, g, r);
    YuvPixel16(src_y[1], src_u[0], src_v[0], &b, &g, &r, yuvconstants);
    StoreAR30(rgb_buf + 4, b, g, r);
    src_y += 2;
    src_u += 1;
    src_v += 1;
    rgb_buf += 8;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel16(src_y[0], src_u[0], src_v[0], &b, &g, &r, yuvconstants);
    StoreAR30(rgb_buf, b, g, r);
  }
}